

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btMultiBodyDynamicsWorld::integrateTransforms(btMultiBodyDynamicsWorld *this,btScalar timeStep)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  btMultiBody *this_00;
  long lVar4;
  undefined8 uVar5;
  btQuaternion *pbVar6;
  btVector3 *pbVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  btAlignedObjectArray<btVector3> local_origin;
  btAlignedObjectArray<btQuaternion> world_to_local;
  btAlignedObjectArray<btVector3> bStack_78;
  btAlignedObjectArray<btQuaternion> local_58;
  btScalar local_34;
  
  local_34 = timeStep;
  btDiscreteDynamicsWorld::integrateTransforms(&this->super_btDiscreteDynamicsWorld,timeStep);
  CProfileManager::Start_Profile("btMultiBody stepPositions");
  local_58.m_ownsMemory = true;
  local_58.m_data = (btQuaternion *)0x0;
  local_58.m_size = 0;
  local_58.m_capacity = 0;
  bStack_78.m_ownsMemory = true;
  bStack_78.m_data = (btVector3 *)0x0;
  bStack_78.m_size = 0;
  bStack_78.m_capacity = 0;
  if (0 < (this->m_multiBodies).m_size) {
    lVar8 = 0;
    do {
      this_00 = (this->m_multiBodies).m_data[lVar8];
      if (this_00->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
        bVar12 = false;
      }
      else {
        bVar12 = *(int *)(this_00->m_baseCollider + 0xec) == 2;
      }
      iVar3 = (this_00->m_links).m_size;
      lVar10 = (long)iVar3;
      if (0 < lVar10) {
        lVar9 = 0;
        do {
          lVar4 = *(long *)((long)((this_00->m_links).m_data)->m_jointTorque + lVar9 + 0x1c);
          if (lVar4 != 0) {
            bVar12 = (bool)(bVar12 | *(int *)(lVar4 + 0xec) == 2);
          }
          lVar9 = lVar9 + 600;
        } while (lVar10 * 600 - lVar9 != 0);
      }
      if (bVar12) {
        btMultiBody::clearVelocities(this_00);
      }
      else {
        if (this_00->__posUpdated == false) {
          btMultiBody::stepPositionsMultiDof(this_00,local_34,(btScalar *)0x0,(btScalar *)0x0);
        }
        else {
          iVar11 = this_00->m_dofCount;
          btMultiBody::stepPositionsMultiDof
                    (this_00,1.0,(btScalar *)0x0,
                     (this_00->m_realBuf).m_data + (iVar11 + iVar11 * iVar11 + 6));
          this_00->__posUpdated = false;
        }
        lVar10 = lVar10 + 1;
        iVar11 = (int)lVar10;
        if ((local_58.m_size <= iVar3) && (local_58.m_capacity <= iVar3)) {
          if (iVar11 == 0) {
            pbVar6 = (btQuaternion *)0x0;
          }
          else {
            pbVar6 = (btQuaternion *)btAlignedAllocInternal(lVar10 * 0x10,0x10);
          }
          if (0 < local_58.m_size) {
            lVar9 = 0;
            do {
              puVar1 = (undefined8 *)((long)((local_58.m_data)->super_btQuadWord).m_floats + lVar9);
              uVar5 = puVar1[1];
              puVar2 = (undefined8 *)((long)(pbVar6->super_btQuadWord).m_floats + lVar9);
              *puVar2 = *puVar1;
              puVar2[1] = uVar5;
              lVar9 = lVar9 + 0x10;
            } while ((ulong)(uint)local_58.m_size << 4 != lVar9);
          }
          if ((local_58.m_data != (btQuaternion *)0x0) && (local_58.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_58.m_data);
          }
          local_58.m_ownsMemory = true;
          local_58._4_8_ = lVar10 << 0x20;
          local_58.m_data = pbVar6;
        }
        local_58.m_size = iVar11;
        if ((bStack_78.m_size <= iVar3) && (bStack_78.m_capacity <= iVar3)) {
          if (iVar11 == 0) {
            pbVar7 = (btVector3 *)0x0;
          }
          else {
            pbVar7 = (btVector3 *)btAlignedAllocInternal((long)iVar11 << 4,0x10);
          }
          if (0 < bStack_78.m_size) {
            lVar9 = 0;
            do {
              puVar1 = (undefined8 *)((long)(bStack_78.m_data)->m_floats + lVar9);
              uVar5 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar7->m_floats + lVar9);
              *puVar2 = *puVar1;
              puVar2[1] = uVar5;
              lVar9 = lVar9 + 0x10;
            } while ((ulong)(uint)bStack_78.m_size << 4 != lVar9);
          }
          if ((bStack_78.m_data != (btVector3 *)0x0) && (bStack_78.m_ownsMemory == true)) {
            btAlignedFreeInternal(bStack_78.m_data);
          }
          bStack_78.m_ownsMemory = true;
          bStack_78._4_8_ = lVar10 << 0x20;
          bStack_78.m_data = pbVar7;
        }
        bStack_78.m_size = iVar11;
        btMultiBody::updateCollisionObjectWorldTransforms(this_00,&local_58,&bStack_78);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->m_multiBodies).m_size);
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&bStack_78);
  btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray(&local_58);
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	btDiscreteDynamicsWorld::integrateTransforms(timeStep);

	{
		BT_PROFILE("btMultiBody stepPositions");
		//integrate and update the Featherstone hierarchies
		btAlignedObjectArray<btQuaternion> world_to_local;
		btAlignedObjectArray<btVector3> local_origin;

		for (int b=0;b<m_multiBodies.size();b++)
		{
			btMultiBody* bod = m_multiBodies[b];
			bool isSleeping = false;
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			}


			if (!isSleeping)
			{
				int nLinks = bod->getNumLinks();

				///base + num m_links
			
				
				{
					if(!bod->isPosUpdated())
						bod->stepPositionsMultiDof(timeStep);
					else
					{
						btScalar *pRealBuf = const_cast<btScalar *>(bod->getVelocityVector());
						pRealBuf += 6 + bod->getNumDofs() + bod->getNumDofs()*bod->getNumDofs();

						bod->stepPositionsMultiDof(1, 0, pRealBuf);
						bod->setPosUpdated(false);
					}
				}
				
				world_to_local.resize(nLinks+1);
				local_origin.resize(nLinks+1);

				bod->updateCollisionObjectWorldTransforms(world_to_local,local_origin);
				
			} else
			{
				bod->clearVelocities();
			}
		}
	}
}